

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3GetInt32(char *zNum,int *pValue)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  byte *pbVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  
  bVar1 = *zNum;
  if (bVar1 == 0x2d) {
    zNum = zNum + 1;
    lVar3 = -1;
  }
  else {
    if (bVar1 == 0x30) {
      if (((byte)(zNum[1] | 0x20U) == 0x78) && ((""[(byte)zNum[2]] & 8) != 0)) {
        pbVar7 = (byte *)(zNum + 2);
        do {
          uVar5 = (ulong)*pbVar7;
          pbVar7 = pbVar7 + 1;
        } while (uVar5 == 0x30);
        bVar11 = true;
        iVar2 = 0;
        uVar8 = 0;
        if ((""[uVar5] & 8) != 0) {
          uVar10 = 0;
          uVar8 = 0;
          do {
            uVar8 = (uint)(((char)((char)uVar5 * '\x02') >> 7 & 9U) + (char)uVar5 & 0xf) |
                    uVar8 << 4;
            uVar5 = (ulong)pbVar7[uVar10];
            if (6 < uVar10) break;
            uVar10 = uVar10 + 1;
          } while ((""[uVar5] & 8) != 0);
          bVar11 = (""[uVar5] & 8) == 0;
        }
        if ((-1 < (int)uVar8) && (bVar11)) {
LAB_0014ce5a:
          *pValue = uVar8;
          iVar2 = 1;
        }
        return iVar2;
      }
    }
    else {
      if (bVar1 != 0x2b) {
        lVar3 = 0;
        bVar4 = bVar1;
        goto LAB_0014cde9;
      }
      zNum = zNum + 1;
    }
    lVar3 = 0;
  }
  bVar4 = *zNum;
LAB_0014cde9:
  if (0xfffffffffffffff5 < (ulong)bVar4 - 0x3a) {
    while (bVar4 == 0x30) {
      bVar4 = ((byte *)zNum)[1];
      zNum = (char *)((byte *)zNum + 1);
    }
    lVar9 = 0;
    lVar6 = 0;
    do {
      if (9 < (byte)(((byte *)zNum)[lVar9] - 0x30)) {
        if (0x7fffffff < lVar3 + lVar6) {
          return 0;
        }
        uVar8 = -(uint)lVar6;
        if (bVar1 != 0x2d) {
          uVar8 = (uint)lVar6;
        }
        goto LAB_0014ce5a;
      }
      lVar6 = (ulong)(((byte *)zNum)[lVar9] & 0xf) + lVar6 * 10;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0xb);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetInt32(const char *zNum, int *pValue){
  sqlite_int64 v = 0;
  int i, c;
  int neg = 0;
  if( zNum[0]=='-' ){
    neg = 1;
    zNum++;
  }else if( zNum[0]=='+' ){
    zNum++;
  }
#ifndef SQLITE_OMIT_HEX_INTEGER
  else if( zNum[0]=='0'
        && (zNum[1]=='x' || zNum[1]=='X')
        && sqlite3Isxdigit(zNum[2])
  ){
    u32 u = 0;
    zNum += 2;
    while( zNum[0]=='0' ) zNum++;
    for(i=0; sqlite3Isxdigit(zNum[i]) && i<8; i++){
      u = u*16 + sqlite3HexToInt(zNum[i]);
    }
    if( (u&0x80000000)==0 && sqlite3Isxdigit(zNum[i])==0 ){
      memcpy(pValue, &u, 4);
      return 1;
    }else{
      return 0;
    }
  }
#endif
  if( !sqlite3Isdigit(zNum[0]) ) return 0;
  while( zNum[0]=='0' ) zNum++;
  for(i=0; i<11 && (c = zNum[i] - '0')>=0 && c<=9; i++){
    v = v*10 + c;
  }

  /* The longest decimal representation of a 32 bit integer is 10 digits:
  **
  **             1234567890
  **     2^31 -> 2147483648
  */
  testcase( i==10 );
  if( i>10 ){
    return 0;
  }
  testcase( v-neg==2147483647 );
  if( v-neg>2147483647 ){
    return 0;
  }
  if( neg ){
    v = -v;
  }
  *pValue = (int)v;
  return 1;
}